

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

void * mpc_realloc(mpc_input_t *i,void *p,size_t n)

{
  mpc_mem_t *pmVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  void *pvVar9;
  undefined8 *puVar10;
  
  pmVar1 = i->mem;
  if (p < i + 1 && pmVar1 <= p) {
    if (0x40 < n) {
      puVar10 = (undefined8 *)malloc(n);
      uVar2 = *(undefined8 *)((long)p + 8);
      uVar3 = *(undefined8 *)((long)p + 0x10);
      uVar4 = *(undefined8 *)((long)p + 0x18);
      uVar5 = *(undefined8 *)((long)p + 0x20);
      uVar6 = *(undefined8 *)((long)p + 0x28);
      uVar7 = *(undefined8 *)((long)p + 0x30);
      uVar8 = *(undefined8 *)((long)p + 0x38);
      *puVar10 = *p;
      puVar10[1] = uVar2;
      puVar10[2] = uVar3;
      puVar10[3] = uVar4;
      puVar10[4] = uVar5;
      puVar10[5] = uVar6;
      puVar10[6] = uVar7;
      puVar10[7] = uVar8;
      if (p < i + 1 && pmVar1 <= p) {
        i->mem_full[(ulong)((long)p - (long)pmVar1) >> 6] = '\0';
        p = puVar10;
      }
      else {
        free(p);
        p = puVar10;
      }
    }
    return (undefined8 *)p;
  }
  pvVar9 = realloc(p,n);
  return pvVar9;
}

Assistant:

static void *mpc_realloc(mpc_input_t *i, void *p, size_t n) {

  char *q = NULL;

  if (!mpc_mem_ptr(i, p)) { return realloc(p, n); }

  if (n > sizeof(mpc_mem_t)) {
    q = malloc(n);
    memcpy(q, p, sizeof(mpc_mem_t));
    mpc_free(i, p);
    return q;
  }

  return p;
}